

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<char_*,_Catch::Matchers::StdString::ContainsMatcher>::MatchExpr
          (MatchExpr<char_*,_Catch::Matchers::StdString::ContainsMatcher> *this,char **arg,
          ContainsMatcher *matcher,StringRef *matcherString)

{
  _func_int *p_Var1;
  undefined8 uVar2;
  byte bVar3;
  undefined8 *in_RCX;
  long *in_RDX;
  _func_int **in_RSI;
  ITransientExpression *in_RDI;
  ContainsMatcher *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  allocator local_41;
  string local_40 [32];
  undefined8 *local_20;
  _func_int **local_10;
  
  p_Var1 = *in_RSI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)p_Var1,&local_41);
  bVar3 = (**(code **)(*in_RDX + 0x18))(in_RDX,local_40);
  ITransientExpression::ITransientExpression(in_RDI,true,(bool)(bVar3 & 1));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  in_RDI->_vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00a16688;
  in_RDI[1]._vptr_ITransientExpression = local_10;
  Matchers::StdString::ContainsMatcher::ContainsMatcher
            ((ContainsMatcher *)CONCAT17(bVar3,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78)
  ;
  in_RDI[9]._vptr_ITransientExpression = (_func_int **)*local_20;
  uVar2 = local_20[1];
  in_RDI[9].m_isBinaryExpression = (bool)(char)uVar2;
  in_RDI[9].m_result = (bool)(char)((ulong)uVar2 >> 8);
  *(int6 *)&in_RDI[9].field_0xa = (int6)((ulong)uVar2 >> 0x10);
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}